

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O3

void av1_calc_mb_wiener_var_row
               (AV1_COMP *cpi,MACROBLOCK *x,MACROBLOCKD *xd,int mi_row,int16_t *src_diff,
               tran_low_t *coeff,tran_low_t *qcoeff,tran_low_t *dqcoeff,double *sum_rec_distortion,
               double *sum_est_rate,uint8_t *pred_buffer)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  SequenceHeader *pSVar4;
  int16_t *piVar5;
  WeberStats *pWVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  TX_SIZE tx_size;
  uint uVar11;
  MACROBLOCKD *pMVar12;
  AV1_COMP *pAVar13;
  uint8_t *puVar14;
  uint16_t *puVar15;
  BitDepthInfo BVar16;
  tran_low_t *ptVar17;
  long lVar18;
  int mi_ext_col;
  int iVar19;
  int iVar20;
  int iVar21;
  byte bVar22;
  ushort uVar23;
  int iVar24;
  MB_MODE_INFO *pMVar25;
  short sVar26;
  MB_MODE_INFO **ppMVar27;
  PREDICTION_MODE mode;
  int pix_col;
  ulong uVar28;
  PREDICTION_MODE mode_00;
  long lVar29;
  uint uVar30;
  long lVar31;
  int64_t iVar32;
  long lVar33;
  bool bVar34;
  byte bVar35;
  int iVar36;
  ulong uVar37;
  byte bVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  uint uVar44;
  uint16_t eob;
  byte local_23a;
  BLOCK_SIZE local_239;
  int local_238;
  int local_234;
  MACROBLOCKD *local_230;
  AV1_COMP *local_228;
  MACROBLOCK *local_220;
  ulong local_218;
  uint8_t *local_210;
  uint16_t *local_208;
  int local_200;
  uint local_1fc;
  uint8_t *local_1f8;
  ulong local_1f0;
  int local_1e4;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  int est_block_rate;
  ulong local_1d0;
  long local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  SCAN_ORDER *local_1b0;
  uint8_t *local_1a8;
  uint8_t *local_1a0;
  uint local_194;
  uint local_190;
  int local_18c;
  AV1EncRowMultiThreadSync *local_188;
  ulong local_180;
  long local_178;
  BitDepthInfo local_170;
  tran_low_t *local_168;
  int16_t *local_160;
  uint8_t *local_158;
  ulong local_150;
  uint16_t *rec;
  ulong local_140;
  ulong local_138;
  long local_130;
  long local_128;
  ulong local_120;
  int64_t local_118;
  MB_MODE_INFO *mbmi_ptr;
  QUANT_PARAM quant_param;
  MB_MODE_INFO mbmi;
  
  local_1a8 = (cpi->source->field_5).buffers[0];
  iVar20 = (cpi->source->field_4).field_0.y_stride;
  local_220 = x;
  local_160 = src_diff;
  memset(&mbmi,0,0xb0);
  xd->mi = &mbmi_ptr;
  local_239 = cpi->weber_bsize;
  local_1b8 = (ulong)local_239;
  local_23a = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [local_1b8];
  local_1f0 = (ulong)local_23a;
  uVar30 = (uint)xd->cur_buf->flags >> 3;
  uVar2 = (cpi->common).mi_params.mi_cols;
  local_180 = (ulong)uVar2;
  local_238 = mi_row / (int)(uint)local_23a;
  local_1e4 = uVar2 + 0x17;
  if (-1 < (int)(uVar2 + 8)) {
    local_1e4 = uVar2 + 8;
  }
  local_210 = (uint8_t *)((ulong)pred_buffer >> 1);
  if ((uVar30 & 1) == 0) {
    local_210 = pred_buffer;
  }
  local_230 = xd;
  if (0 < (int)uVar2) {
    local_1d0 = (ulong)""[local_1b8];
    uVar2 = tx_size_wide[local_1d0];
    local_178 = (long)(int)uVar2;
    local_1d8 = uVar2 * uVar2;
    local_170 = (BitDepthInfo)(CONCAT44(uVar30,xd->bd) & 0x1ffffffff);
    local_188 = &cpi->ppi->intra_row_mt_sync;
    local_1e4 = local_1e4 >> 4;
    local_18c = mi_row * -0x20;
    local_138 = 0x3efffcL >> (local_239 & 0x3f);
    local_140 = 0x20005L >> (local_239 & 0x3f);
    local_194 = mi_row - 1;
    local_1a8 = local_1a8 + iVar20 * mi_row * 4;
    local_1b0 = av1_scan_orders[""[local_1b8]];
    local_150 = 1;
    if (1 < (int)uVar2) {
      local_150 = (ulong)uVar2;
    }
    local_190 = local_23a - 1;
    local_1fc = (uint)local_23a * 4;
    rec = (uint16_t *)((long)local_210 * 2);
    local_1c0 = (ulong)local_1d8;
    local_128 = (long)iVar20 * 2;
    local_1e0 = 0;
    local_200 = 0;
    uVar40 = 0;
    local_228 = cpi;
    local_218 = (ulong)(uint)mi_row;
    local_1c8 = (long)iVar20;
    local_168 = coeff;
    mbmi_ptr = &mbmi;
    do {
      if ((uVar40 & 0xf) == 0) {
        (*(cpi->mt_info).intra_mt.intra_sync_read_ptr)(local_188,local_238,local_200);
        iVar20 = (cpi->mt_info).num_workers;
        iVar19 = (cpi->mt_info).num_mod_workers[0xb];
        if (iVar19 < iVar20) {
          iVar20 = iVar19;
        }
        if (1 < iVar20) {
          pthread_mutex_lock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
          _Var1 = (cpi->mt_info).enc_row_mt.mb_wiener_mt_exit;
          pthread_mutex_unlock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
          if (_Var1 != false) break;
        }
      }
      bVar22 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [local_1b8];
      iVar20 = (cpi->common).mi_params.mi_stride;
      uVar30 = (uint)local_218;
      uVar44 = (uint)uVar40;
      iVar19 = (int)uVar44 /
               (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [(cpi->common).mi_params.mi_alloc_bsize];
      iVar21 = (int)((long)((ulong)(uint)((int)uVar30 >> 0x1f) << 0x20 | local_218 & 0xffffffff) /
                    (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                     [(cpi->common).mi_params.mi_alloc_bsize]);
      iVar36 = iVar20 * uVar30 + uVar44;
      (cpi->common).mi_params.mi_grid_base[iVar36] =
           (cpi->common).mi_params.mi_alloc +
           ((cpi->common).mi_params.mi_alloc_stride * iVar21 + iVar19);
      ppMVar27 = (cpi->common).mi_params.mi_grid_base + iVar36;
      local_230->mi = ppMVar27;
      local_230->tx_type_map = (cpi->common).mi_params.tx_type_map + iVar36;
      local_230->tx_type_map_stride = iVar20;
      local_220->mbmi_ext_frame =
           (cpi->mbmi_ext_info).frame_base + (iVar21 * (cpi->mbmi_ext_info).stride + iVar19);
      iVar19 = bVar22 + uVar30;
      iVar20 = (cpi->common).mi_params.mi_rows;
      uVar2 = (cpi->common).mi_params.mi_cols;
      if (iVar19 < iVar20) {
        iVar20 = iVar19;
      }
      local_1dc = uVar44 + (int)local_1f0;
      if ((int)local_1dc < (int)uVar2) {
        uVar2 = local_1dc;
      }
      iVar21 = (local_230->tile).mi_row_start;
      iVar36 = (local_230->tile).mi_col_start;
      local_230->mb_to_top_edge = local_18c;
      local_230->mb_to_bottom_edge = (iVar20 - iVar19) * 0x20;
      local_230->mb_to_left_edge = uVar44 * -0x20;
      local_230->mb_to_right_edge = (uVar2 - local_1dc) * 0x20;
      local_230->mi_row = uVar30;
      local_230->mi_col = uVar44;
      local_230->left_available = iVar36 < (int)uVar44;
      local_230->up_available = iVar21 < (int)uVar30;
      uVar2 = local_230->plane[1].subsampling_x;
      uVar3 = local_230->plane[1].subsampling_y;
      local_230->chroma_up_available = iVar21 < (int)uVar30;
      bVar34 = iVar36 < (int)(uVar44 - 1);
      if (uVar2 == 0) {
        bVar34 = iVar36 < (int)uVar44;
      }
      if ((local_138 & 1) != 0) {
        bVar34 = iVar36 < (int)uVar44;
      }
      local_230->chroma_left_available = bVar34;
      uVar11 = uVar30;
      if (uVar3 != 0 && (local_140 & 1) != 0) {
        local_230->chroma_up_available = iVar21 < (int)local_194;
        uVar11 = local_194;
      }
      if (iVar21 < (int)uVar30) {
        pMVar25 = ppMVar27[-(long)local_230->mi_stride];
      }
      else {
        pMVar25 = (MB_MODE_INFO *)0x0;
      }
      local_230->above_mbmi = pMVar25;
      if (iVar36 < (int)uVar44) {
        pMVar25 = ppMVar27[-1];
      }
      else {
        pMVar25 = (MB_MODE_INFO *)0x0;
      }
      local_230->left_mbmi = pMVar25;
      if (((local_218 & 1) == 0) && ((bVar22 & uVar3 != 0) != 0)) {
        local_230->is_chroma_ref = false;
      }
      else {
        if ((uVar40 & 1) == 0 && (local_23a & 1) != 0) {
          local_230->is_chroma_ref = uVar2 == 0;
          if (uVar2 != 0) goto LAB_0019115b;
        }
        else {
          local_230->is_chroma_ref = true;
        }
        iVar20 = local_230->mi_stride;
        iVar19 = (uVar2 & uVar44) + (uVar3 & uVar30) * iVar20;
        if (iVar21 < (int)uVar11) {
          pMVar25 = ppMVar27[(long)-iVar19 + (long)(int)(uVar2 - iVar20)];
        }
        else {
          pMVar25 = (MB_MODE_INFO *)0x0;
        }
        local_230->chroma_above_mbmi = pMVar25;
        if (bVar34 == false) {
          pMVar25 = (MB_MODE_INFO *)0x0;
        }
        else {
          pMVar25 = ppMVar27[(long)-iVar19 + (long)(int)(iVar20 * uVar3) + -1];
        }
        local_230->chroma_left_mbmi = pMVar25;
      }
LAB_0019115b:
      local_230->height = bVar22;
      local_230->width = local_23a;
      local_230->is_last_vertical_rect = false;
      if ((local_23a < bVar22) && ((bVar22 - 1 & local_1dc) == 0)) {
        local_230->is_last_vertical_rect = true;
      }
      local_1a0 = local_1a8 + local_1e0;
      local_230->is_first_horizontal_rect = bVar22 < local_23a && (uVar30 & local_190) == 0;
      lVar31 = 0xa30;
      if (((local_228->common).seq_params)->monochrome == '\0') {
        lVar31 = 0x1e90;
      }
      lVar33 = 0;
      do {
        bVar35 = (byte)(((uint)bVar22 << 2) >>
                       (*(byte *)((long)local_230->plane[0].pre + lVar33 + -0x28) & 0x1f));
        bVar38 = (byte)(local_1fc >>
                       (*(byte *)((long)local_230->plane[0].pre + lVar33 + -0x2c) & 0x1f));
        if (bVar38 < 5) {
          bVar38 = 4;
        }
        *(byte *)((long)(local_230->plane[0].seg_iqmatrix + -1) + lVar33 + 0x90) = bVar38;
        if (bVar35 < 5) {
          bVar35 = 4;
        }
        *(byte *)((long)(local_230->plane[0].seg_iqmatrix + -1) + lVar33 + 0x91) = bVar35;
        lVar33 = lVar33 + 0xa30;
      } while (lVar31 != lVar33);
      pMVar25 = *ppMVar27;
      pMVar25->bsize = local_239;
      pMVar25->motion_mode = '\0';
      if (iVar21 < (int)uVar30) {
        local_230->above_mbmi = (MB_MODE_INFO *)0x0;
      }
      if (iVar36 < (int)uVar44) {
        local_230->left_mbmi = (MB_MODE_INFO *)0x0;
      }
      local_1f8 = local_1a8 + uVar44 * 4;
      local_234 = 0x7fffffff;
      mode_00 = '\0';
      mode = '\0';
      local_208 = (uint16_t *)uVar40;
      do {
        lVar31 = local_178;
        puVar14 = local_1f8;
        pSVar4 = (local_228->common).seq_params;
        iVar20 = (int)local_178;
        av1_predict_intra_block
                  (local_230,pSVar4->sb_size,(uint)pSVar4->enable_intra_edge_filter,iVar20,iVar20,
                   (TX_SIZE)local_1d0,mode,0,0,'\x05',local_1f8,(int)local_1c8,local_210,0x80,0,0,0)
        ;
        piVar5 = local_160;
        BVar16 = local_170;
        av1_subtract_block(local_170,iVar20,iVar20,local_160,lVar31,puVar14,local_1c8,local_210,0x80
                          );
        ptVar17 = local_168;
        av1_quick_txfm(0,(TX_SIZE)local_1d0,BVar16,piVar5,iVar20,local_168);
        iVar20 = (*aom_satd)(ptVar17,local_1d8);
        lVar33 = local_178;
        lVar31 = local_1c8;
        uVar40 = local_1d0;
        puVar14 = local_1f8;
        if (iVar20 < local_234) {
          local_234 = iVar20;
          mode_00 = mode;
        }
        mode = mode + '\x01';
      } while (mode != '\r');
      pSVar4 = (local_228->common).seq_params;
      iVar20 = (int)local_178;
      tx_size = (TX_SIZE)local_1d0;
      av1_predict_intra_block
                (local_230,pSVar4->sb_size,(uint)pSVar4->enable_intra_edge_filter,iVar20,iVar20,
                 tx_size,mode_00,0,0,'\x05',local_1f8,(int)local_1c8,local_210,0x80,0,0,0);
      piVar5 = local_160;
      BVar16 = local_170;
      av1_subtract_block(local_170,iVar20,iVar20,local_160,lVar33,puVar14,lVar31,local_210,0x80);
      ptVar17 = local_168;
      av1_quick_txfm(0,tx_size,BVar16,piVar5,iVar20,local_168);
      bVar22 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[txsize_to_bsize[uVar40]]
      ;
      av1_setup_quant(tx_size,0,0,0,&quant_param);
      local_130 = (long)(1 << (bVar22 & 0x1f));
      if ((local_230->cur_buf->flags & 8) == 0) {
        av1_quantize_fp_facade
                  (ptVar17,local_130,local_220->plane,qcoeff,dqcoeff,&eob,local_1b0,&quant_param);
      }
      else {
        av1_highbd_quantize_fp_facade
                  (ptVar17,local_130,local_220->plane,qcoeff,dqcoeff,&eob,local_1b0,&quant_param);
      }
      uVar23 = eob;
      if ((local_228->oxcf).enable_rate_guide_deltaq != 0) {
        if (eob == 0) {
          iVar20 = 0x200;
          uVar23 = 0;
        }
        else {
          uVar28 = (ulong)eob;
          piVar5 = ((SCAN_ORDER *)&local_1b0->scan)->scan;
          iVar20 = 1;
          uVar40 = 0;
          do {
            iVar19 = qcoeff[piVar5[uVar40]];
            iVar21 = -iVar19;
            if (0 < iVar19) {
              iVar21 = iVar19;
            }
            dVar10 = log1p((double)iVar21);
            iVar20 = (iVar20 - (uint)(iVar19 == 0)) + (int)(dVar10 / 0.6931471805599453) + 2;
            uVar40 = uVar40 + 1;
          } while (uVar28 != uVar40);
          iVar20 = iVar20 * 0x200;
          uVar40 = local_1d0;
          uVar23 = eob;
        }
        local_228->prep_rate_estimates
        [(int)(((ulong)local_208 & 0xffffffff) / (local_1f0 & 0xffffffff)) +
         (local_228->frame_info).mi_cols * local_238] = iVar20;
      }
      uVar28 = local_1f0;
      puVar15 = local_208;
      puVar14 = local_210;
      pAVar13 = local_228;
      pMVar12 = local_230;
      iVar20 = local_238;
      av1_inverse_transform_block
                (local_230,dqcoeff,0,'\0',(TX_SIZE)uVar40,local_210,0x80,(uint)uVar23,0);
      uVar30 = local_1fc;
      cpi = local_228;
      pWVar6 = pAVar13->mb_weber_stats;
      iVar20 = (int)(((ulong)puVar15 & 0xffffffff) / (uVar28 & 0xffffffff)) +
               (pAVar13->frame_info).mi_cols * iVar20;
      pWVar6[iVar20].src_pix_max = 1;
      pWVar6[iVar20].rec_pix_max = 1;
      pWVar6[iVar20].src_variance = 0;
      (&pWVar6[iVar20].src_variance)[1] = 0;
      pWVar6[iVar20].distortion = 0;
      uVar2 = pMVar12->cur_buf->flags;
      uVar40 = 1;
      local_208 = rec;
      lVar33 = 0;
      uVar37 = 1;
      lVar31 = 0;
      iVar32 = 0;
      lVar42 = 0;
      lVar41 = 0;
      lVar29 = 0;
      lVar18 = (long)local_1f8 * 2;
      uVar28 = 0;
      local_158 = puVar14;
      do {
        local_120 = uVar28;
        local_1f8 = (uint8_t *)lVar18;
        uVar28 = 0;
        do {
          if ((uVar2 & 8) == 0) {
            uVar43 = (ulong)local_1a0[uVar28];
            uVar39 = (ulong)local_158[uVar28];
          }
          else {
            uVar43 = (ulong)*(ushort *)((long)local_1f8 + uVar28 * 2);
            uVar39 = (ulong)local_208[uVar28];
          }
          iVar36 = (int)uVar43;
          lVar29 = lVar29 + uVar43;
          iVar21 = (int)uVar39;
          lVar41 = lVar41 + uVar39;
          iVar19 = iVar36 - iVar21;
          lVar42 = lVar42 + iVar19;
          iVar32 = iVar32 + (ulong)(uint)(iVar36 * iVar36);
          pWVar6[iVar20].src_variance = iVar32;
          lVar31 = lVar31 + (ulong)(uint)(iVar21 * iVar21);
          sVar26 = (short)uVar37;
          uVar37 = (ulong)(uint)(int)sVar26;
          if (sVar26 <= iVar36) {
            uVar37 = uVar43;
          }
          pWVar6[iVar20].rec_variance = lVar31;
          pWVar6[iVar20].src_pix_max = (int16_t)uVar37;
          sVar26 = (short)uVar40;
          uVar40 = (ulong)(uint)(int)sVar26;
          if (sVar26 <= iVar21) {
            uVar40 = uVar39;
          }
          pWVar6[iVar20].rec_pix_max = (int16_t)uVar40;
          lVar33 = lVar33 + (ulong)(uint)(iVar19 * iVar19);
          pWVar6[iVar20].distortion = lVar33;
          uVar28 = uVar28 + 1;
        } while (local_150 != uVar28);
        local_158 = local_158 + 0x80;
        local_1a0 = local_1a0 + local_1c8;
        local_208 = local_208 + 0x80;
        lVar18 = (long)local_1f8 + local_128;
        uVar28 = local_120 + 1;
      } while (local_120 + 1 != local_150);
      if ((local_228->oxcf).intra_mode_cfg.auto_intra_tools_off != false) {
        *sum_rec_distortion = (double)lVar33 + *sum_rec_distortion;
        est_block_rate = 0;
        local_118 = 0;
        bVar22 = 3;
        if ((((local_220->e_mbd).cur_buf)->flags & 8) != 0) {
          bVar22 = (char)(local_220->e_mbd).bd - 5;
        }
        if ((local_228->sf).rd_sf.simple_model_rd_from_var == 0) {
          av1_model_rd_from_var_lapndz
                    (pWVar6[iVar20].distortion,
                     (uint)"\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[local_1b8],
                     (int)local_220->plane[0].dequant_QTX[1] >> (bVar22 & 0x1f),&est_block_rate,
                     &local_118);
          iVar19 = est_block_rate;
        }
        else {
          iVar21 = (int)local_220->plane[0].dequant_QTX[1] >> (bVar22 & 0x1f);
          iVar19 = 0;
          if (iVar21 < 0x78) {
            lVar31 = (long)(pWVar6[iVar20].distortion * (ulong)(0x118 - iVar21)) >> 7;
            if (0x7ffffffe < lVar31) {
              lVar31 = 0x7fffffff;
            }
            iVar19 = (int)lVar31;
          }
        }
        *sum_est_rate = (double)iVar19 + *sum_est_rate;
        iVar32 = pWVar6[iVar20].src_variance;
        lVar31 = pWVar6[iVar20].rec_variance;
        lVar33 = pWVar6[iVar20].distortion;
      }
      iVar19 = local_200;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = lVar29 * lVar29;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = lVar41 * lVar41;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = lVar42 * lVar42;
      pWVar6[iVar20].src_variance = iVar32 - SUB168(auVar7 / SEXT816(local_130),0);
      pWVar6[iVar20].rec_variance = lVar31 - SUB168(auVar8 / SEXT816(local_130),0);
      pWVar6[iVar20].distortion = lVar33 - SUB168(auVar9 / SEXT816(local_130),0);
      pWVar6[iVar20].satd = (long)local_234;
      *qcoeff = 0;
      dVar10 = 0.0;
      if (1 < local_1d8) {
        iVar21 = 0;
        uVar40 = 1;
        do {
          iVar36 = qcoeff[uVar40];
          iVar24 = -iVar36;
          if (0 < iVar36) {
            iVar24 = iVar36;
          }
          if (iVar24 < iVar21) {
            iVar24 = iVar21;
          }
          iVar21 = iVar24;
          uVar40 = uVar40 + 1;
        } while (local_1c0 != uVar40);
        dVar10 = (double)iVar21;
      }
      pWVar6[iVar20].max_scale = dVar10;
      if ((int)local_180 <= (int)local_1dc || (local_1dc & 0xf) == 0) {
        (*(cpi->mt_info).intra_mt.intra_sync_write_ptr)(local_188,local_238,local_200,local_1e4);
        local_200 = iVar19 + 1;
      }
      uVar40 = (ulong)local_1dc;
      local_1e0 = local_1e0 + uVar30;
    } while ((int)local_1dc < (int)local_180);
  }
  local_230->mi = (MB_MODE_INFO **)0x0;
  return;
}

Assistant:

void av1_calc_mb_wiener_var_row(AV1_COMP *const cpi, MACROBLOCK *x,
                                MACROBLOCKD *xd, const int mi_row,
                                int16_t *src_diff, tran_low_t *coeff,
                                tran_low_t *qcoeff, tran_low_t *dqcoeff,
                                double *sum_rec_distortion,
                                double *sum_est_rate, uint8_t *pred_buffer) {
  AV1_COMMON *const cm = &cpi->common;
  uint8_t *buffer = cpi->source->y_buffer;
  int buf_stride = cpi->source->y_stride;
  MB_MODE_INFO mbmi;
  memset(&mbmi, 0, sizeof(mbmi));
  MB_MODE_INFO *mbmi_ptr = &mbmi;
  xd->mi = &mbmi_ptr;
  const BLOCK_SIZE bsize = cpi->weber_bsize;
  const TX_SIZE tx_size = max_txsize_lookup[bsize];
  const int block_size = tx_size_wide[tx_size];
  const int coeff_count = block_size * block_size;
  const int mb_step = mi_size_wide[bsize];
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  const MultiThreadInfo *const mt_info = &cpi->mt_info;
  const AV1EncAllIntraMultiThreadInfo *const intra_mt = &mt_info->intra_mt;
  AV1EncRowMultiThreadSync *const intra_row_mt_sync =
      &cpi->ppi->intra_row_mt_sync;
  const int mi_cols = cm->mi_params.mi_cols;
  const int mt_thread_id = mi_row / mb_step;
  // TODO(chengchen): test different unit step size
  const int mt_unit_step = mi_size_wide[MB_WIENER_MT_UNIT_SIZE];
  const int mt_unit_cols = (mi_cols + (mt_unit_step >> 1)) / mt_unit_step;
  int mt_unit_col = 0;
  const int is_high_bitdepth = is_cur_buf_hbd(xd);

  uint8_t *dst_buffer = pred_buffer;
  const int dst_buffer_stride = MB_WIENER_PRED_BUF_STRIDE;

  if (is_high_bitdepth) {
    uint16_t *pred_buffer_16 = (uint16_t *)pred_buffer;
    dst_buffer = CONVERT_TO_BYTEPTR(pred_buffer_16);
  }

  for (int mi_col = 0; mi_col < mi_cols; mi_col += mb_step) {
    if (mi_col % mt_unit_step == 0) {
      intra_mt->intra_sync_read_ptr(intra_row_mt_sync, mt_thread_id,
                                    mt_unit_col);
#if CONFIG_MULTITHREAD
      const int num_workers =
          AOMMIN(mt_info->num_mod_workers[MOD_AI], mt_info->num_workers);
      if (num_workers > 1) {
        const AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
        pthread_mutex_lock(enc_row_mt->mutex_);
        const bool exit = enc_row_mt->mb_wiener_mt_exit;
        pthread_mutex_unlock(enc_row_mt->mutex_);
        // Stop further processing in case any worker has encountered an error.
        if (exit) break;
      }
#endif
    }

    PREDICTION_MODE best_mode = DC_PRED;
    int best_intra_cost = INT_MAX;
    const int mi_width = mi_size_wide[bsize];
    const int mi_height = mi_size_high[bsize];
    set_mode_info_offsets(&cpi->common.mi_params, &cpi->mbmi_ext_info, x, xd,
                          mi_row, mi_col);
    set_mi_row_col(xd, &xd->tile, mi_row, mi_height, mi_col, mi_width,
                   AOMMIN(mi_row + mi_height, cm->mi_params.mi_rows),
                   AOMMIN(mi_col + mi_width, cm->mi_params.mi_cols));
    set_plane_n4(xd, mi_size_wide[bsize], mi_size_high[bsize],
                 av1_num_planes(cm));
    xd->mi[0]->bsize = bsize;
    xd->mi[0]->motion_mode = SIMPLE_TRANSLATION;
    // Set above and left mbmi to NULL as they are not available in the
    // preprocessing stage.
    // They are used to detemine intra edge filter types in intra prediction.
    if (xd->up_available) {
      xd->above_mbmi = NULL;
    }
    if (xd->left_available) {
      xd->left_mbmi = NULL;
    }
    uint8_t *mb_buffer =
        buffer + mi_row * MI_SIZE * buf_stride + mi_col * MI_SIZE;
    for (PREDICTION_MODE mode = INTRA_MODE_START; mode < INTRA_MODE_END;
         ++mode) {
      // TODO(chengchen): Here we use src instead of reconstructed frame as
      // the intra predictor to make single and multithread version match.
      // Ideally we want to use the reconstructed.
      av1_predict_intra_block(
          xd, cm->seq_params->sb_size, cm->seq_params->enable_intra_edge_filter,
          block_size, block_size, tx_size, mode, 0, 0, FILTER_INTRA_MODES,
          mb_buffer, buf_stride, dst_buffer, dst_buffer_stride, 0, 0, 0);
      av1_subtract_block(bd_info, block_size, block_size, src_diff, block_size,
                         mb_buffer, buf_stride, dst_buffer, dst_buffer_stride);
      av1_quick_txfm(0, tx_size, bd_info, src_diff, block_size, coeff);
      int intra_cost = aom_satd(coeff, coeff_count);
      if (intra_cost < best_intra_cost) {
        best_intra_cost = intra_cost;
        best_mode = mode;
      }
    }

    av1_predict_intra_block(
        xd, cm->seq_params->sb_size, cm->seq_params->enable_intra_edge_filter,
        block_size, block_size, tx_size, best_mode, 0, 0, FILTER_INTRA_MODES,
        mb_buffer, buf_stride, dst_buffer, dst_buffer_stride, 0, 0, 0);
    av1_subtract_block(bd_info, block_size, block_size, src_diff, block_size,
                       mb_buffer, buf_stride, dst_buffer, dst_buffer_stride);
    av1_quick_txfm(0, tx_size, bd_info, src_diff, block_size, coeff);

    const struct macroblock_plane *const p = &x->plane[0];
    uint16_t eob;
    const SCAN_ORDER *const scan_order = &av1_scan_orders[tx_size][DCT_DCT];
    QUANT_PARAM quant_param;
    int pix_num = 1 << num_pels_log2_lookup[txsize_to_bsize[tx_size]];
    av1_setup_quant(tx_size, 0, AV1_XFORM_QUANT_FP, 0, &quant_param);
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_cur_buf_hbd(xd)) {
      av1_highbd_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob,
                                    scan_order, &quant_param);
    } else {
      av1_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob,
                             scan_order, &quant_param);
    }
#else
    av1_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob, scan_order,
                           &quant_param);
#endif  // CONFIG_AV1_HIGHBITDEPTH

    if (cpi->oxcf.enable_rate_guide_deltaq) {
      const int rate_cost = rate_estimator(qcoeff, eob, tx_size);
      cpi->prep_rate_estimates[(mi_row / mb_step) * cpi->frame_info.mi_cols +
                               (mi_col / mb_step)] = rate_cost;
    }

    av1_inverse_transform_block(xd, dqcoeff, 0, DCT_DCT, tx_size, dst_buffer,
                                dst_buffer_stride, eob, 0);
    WeberStats *weber_stats =
        &cpi->mb_weber_stats[(mi_row / mb_step) * cpi->frame_info.mi_cols +
                             (mi_col / mb_step)];

    weber_stats->rec_pix_max = 1;
    weber_stats->rec_variance = 0;
    weber_stats->src_pix_max = 1;
    weber_stats->src_variance = 0;
    weber_stats->distortion = 0;

    int64_t src_mean = 0;
    int64_t rec_mean = 0;
    int64_t dist_mean = 0;

    for (int pix_row = 0; pix_row < block_size; ++pix_row) {
      for (int pix_col = 0; pix_col < block_size; ++pix_col) {
        int src_pix, rec_pix;
#if CONFIG_AV1_HIGHBITDEPTH
        if (is_cur_buf_hbd(xd)) {
          uint16_t *src = CONVERT_TO_SHORTPTR(mb_buffer);
          uint16_t *rec = CONVERT_TO_SHORTPTR(dst_buffer);
          src_pix = src[pix_row * buf_stride + pix_col];
          rec_pix = rec[pix_row * dst_buffer_stride + pix_col];
        } else {
          src_pix = mb_buffer[pix_row * buf_stride + pix_col];
          rec_pix = dst_buffer[pix_row * dst_buffer_stride + pix_col];
        }
#else
        src_pix = mb_buffer[pix_row * buf_stride + pix_col];
        rec_pix = dst_buffer[pix_row * dst_buffer_stride + pix_col];
#endif
        src_mean += src_pix;
        rec_mean += rec_pix;
        dist_mean += src_pix - rec_pix;
        weber_stats->src_variance += src_pix * src_pix;
        weber_stats->rec_variance += rec_pix * rec_pix;
        weber_stats->src_pix_max = AOMMAX(weber_stats->src_pix_max, src_pix);
        weber_stats->rec_pix_max = AOMMAX(weber_stats->rec_pix_max, rec_pix);
        weber_stats->distortion += (src_pix - rec_pix) * (src_pix - rec_pix);
      }
    }

    if (cpi->oxcf.intra_mode_cfg.auto_intra_tools_off) {
      *sum_rec_distortion += weber_stats->distortion;
      int est_block_rate = 0;
      int64_t est_block_dist = 0;
      model_rd_sse_fn[MODELRD_LEGACY](cpi, x, bsize, 0, weber_stats->distortion,
                                      pix_num, &est_block_rate,
                                      &est_block_dist);
      *sum_est_rate += est_block_rate;
    }

    weber_stats->src_variance -= (src_mean * src_mean) / pix_num;
    weber_stats->rec_variance -= (rec_mean * rec_mean) / pix_num;
    weber_stats->distortion -= (dist_mean * dist_mean) / pix_num;
    weber_stats->satd = best_intra_cost;

    qcoeff[0] = 0;
    int max_scale = 0;
    for (int idx = 1; idx < coeff_count; ++idx) {
      const int abs_qcoeff = abs(qcoeff[idx]);
      max_scale = AOMMAX(max_scale, abs_qcoeff);
    }
    weber_stats->max_scale = max_scale;

    if ((mi_col + mb_step) % mt_unit_step == 0 ||
        (mi_col + mb_step) >= mi_cols) {
      intra_mt->intra_sync_write_ptr(intra_row_mt_sync, mt_thread_id,
                                     mt_unit_col, mt_unit_cols);
      ++mt_unit_col;
    }
  }
  // Set the pointer to null since mbmi is only allocated inside this function.
  xd->mi = NULL;
}